

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     sar<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination,uint8_t count,Context *context)

{
  ushort uVar1;
  uint uVar2;
  unsigned_short value;
  undefined7 in_register_00000031;
  ushort uVar3;
  
  if ((int)CONCAT71(in_register_00000031,count) != 0) {
    uVar1 = *destination;
    uVar2 = uVar1 & 0x8000;
    if (count < 0x10) {
      uVar3 = 0;
      if ((short)uVar2 != 0) {
        uVar3 = (ushort)(-0x10000 >> (count & 0x1f));
      }
      value = uVar3 | uVar1 >> (count & 0x1f);
      uVar2 = 1 << (count - 1 & 0x1f) & (uint)uVar1;
    }
    else {
      value = (unsigned_short)((uint)(int)(short)uVar1 >> 0xf);
    }
    (context->flags).carry_ = uVar2;
    *destination = value;
    (context->flags).overflow_ = 0;
    Flags::
    set_from<unsigned_short,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)8>
              (&context->flags,value);
    return;
  }
  return;
}

Assistant:

void sar(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	if(!count) {
		return;
	}

	const IntT sign = Numeric::top_bit<IntT>() & destination;
	if(count >= Numeric::bit_size<IntT>()) {
		destination = sign ? IntT(~0) : IntT(0);
		context.flags.template set_from<Flag::Carry>(sign);
	} else {
		const auto mask = IntT(1 << (count - 1));
		context.flags.template set_from<Flag::Carry>(destination & mask);
		destination = (destination >> count) | (sign ? ~(IntT(~0) >> count) : 0);
	}
	context.flags.template set_from<Flag::Overflow>(0);
	context.flags.template set_from<IntT, Flag::Sign, Flag::Zero, Flag::ParityOdd>(destination);
}